

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>
wasm::Builder::makeTable(Name name,Type type,Address initial,Address max,Type addressType)

{
  undefined8 *puVar1;
  long lVar2;
  __uniq_ptr_data<wasm::Table,_std::default_delete<wasm::Table>,_true,_true> _Var3;
  undefined8 in_stack_00000008;
  
  _Var3.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
  super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl = name.super_IString.str._M_len;
  std::make_unique<wasm::Table>();
  puVar1 = *(undefined8 **)
            _Var3.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
            super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
  *puVar1 = name.super_IString.str._M_str;
  puVar1[1] = type.id;
  lVar2 = *(long *)_Var3.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                   super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
  *(address64_t *)(lVar2 + 0x50) = initial.addr;
  *(undefined8 *)(lVar2 + 0x48) = in_stack_00000008;
  *(address64_t *)(lVar2 + 0x38) = max.addr;
  *(uintptr_t *)(lVar2 + 0x40) = addressType.id;
  return (__uniq_ptr_data<wasm::Table,_std::default_delete<wasm::Table>,_true,_true>)
         (tuple<wasm::Table_*,_std::default_delete<wasm::Table>_>)
         _Var3.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
         super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
}

Assistant:

static std::unique_ptr<Table> makeTable(Name name,
                                          Type type = Type(HeapType::func,
                                                           Nullable),
                                          Address initial = 0,
                                          Address max = Table::kMaxSize,
                                          Type addressType = Type::i32) {
    auto table = std::make_unique<Table>();
    table->name = name;
    table->type = type;
    table->addressType = addressType;
    table->initial = initial;
    table->max = max;
    return table;
  }